

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_linux.c
# Opt level: O0

int os_interface_linux_state_set(os_interface *os_if,_Bool up)

{
  oonf_log_source oVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 in_stack_ffffffffffffff40;
  undefined4 uVar6;
  char local_78 [8];
  ifreq ifr;
  int oldflags;
  _Bool up_local;
  os_interface *os_if_local;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  ifr.ifr_ifru._23_1_ = up;
  memset(local_78,0,0x28);
  strscpy(local_78,os_if->name,0x10);
  iVar2 = os_system_linux_linux_get_ioctl_fd(2);
  iVar2 = ioctl(iVar2,0x8913,local_78);
  oVar1 = _oonf_os_interface_subsystem.logging;
  if (iVar2 < 0) {
    if ((log_global_mask[_oonf_os_interface_subsystem.logging] & 4) != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      piVar3 = __errno_location();
      oonf_log(LOG_SEVERITY_WARN,oVar1,"src/base/os_linux/os_interface_linux.c",0x197,(void *)0x0,0,
               "ioctl SIOCGIFFLAGS (get flags) error on device %s: %s (%d)\n",os_if->name,pcVar4,
               CONCAT44(uVar6,*piVar3));
    }
    os_if_local._4_4_ = -1;
  }
  else {
    ifr.ifr_ifru._16_4_ = SEXT24((short)ifr.ifr_ifrn._8_2_);
    if ((ifr.ifr_ifru._23_1_ & 1) == 0) {
      ifr.ifr_ifrn._8_2_ = ifr.ifr_ifrn._8_2_ & 0xfffe;
    }
    else {
      ifr.ifr_ifrn._8_2_ = ifr.ifr_ifrn._8_2_ | 1;
    }
    if (ifr.ifr_ifru._16_4_ == (int)(short)ifr.ifr_ifrn._8_2_) {
      os_if_local._4_4_ = 0;
    }
    else {
      iVar2 = os_system_linux_linux_get_ioctl_fd(2);
      iVar2 = ioctl(iVar2,0x8914,local_78);
      oVar1 = _oonf_os_interface_subsystem.logging;
      if (iVar2 < 0) {
        if ((log_global_mask[_oonf_os_interface_subsystem.logging] & 4) != 0) {
          pcVar4 = "down";
          if ((ifr.ifr_ifru._23_1_ & 1) != 0) {
            pcVar4 = "up";
          }
          piVar3 = __errno_location();
          pcVar5 = strerror(*piVar3);
          piVar3 = __errno_location();
          oonf_log(LOG_SEVERITY_WARN,oVar1,"src/base/os_linux/os_interface_linux.c",0x1aa,
                   (void *)0x0,0,"ioctl SIOCSIFFLAGS (set flags %s) error on device %s: %s (%d)\n",
                   pcVar4,os_if->name,pcVar5,*piVar3);
        }
        os_if_local._4_4_ = -1;
      }
      else {
        os_if_local._4_4_ = 0;
      }
    }
  }
  return os_if_local._4_4_;
}

Assistant:

int
os_interface_linux_state_set(struct os_interface *os_if, bool up) {
  int oldflags;
  struct ifreq ifr;

  memset(&ifr, 0, sizeof(ifr));
  strscpy(ifr.ifr_name, os_if->name, IF_NAMESIZE);

  if (ioctl(os_system_linux_linux_get_ioctl_fd(AF_INET), SIOCGIFFLAGS, &ifr) < 0) {
    OONF_WARN(LOG_OS_INTERFACE, "ioctl SIOCGIFFLAGS (get flags) error on device %s: %s (%d)\n", os_if->name,
      strerror(errno), errno);
    return -1;
  }

  oldflags = ifr.ifr_flags;
  if (up) {
    ifr.ifr_flags |= IFF_UP;
  }
  else {
    ifr.ifr_flags &= ~IFF_UP;
  }

  if (oldflags == ifr.ifr_flags) {
    /* interface is already up/down */
    return 0;
  }

  if (ioctl(os_system_linux_linux_get_ioctl_fd(AF_INET), SIOCSIFFLAGS, &ifr) < 0) {
    OONF_WARN(LOG_OS_INTERFACE, "ioctl SIOCSIFFLAGS (set flags %s) error on device %s: %s (%d)\n", up ? "up" : "down",
      os_if->name, strerror(errno), errno);
    return -1;
  }
  return 0;
}